

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DoubletonEquationPS::execute
          (DoubletonEquationPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *param_3,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *r,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             *cStatus,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *rStatus,bool isOptimal)

{
  char cVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  pointer pnVar3;
  VarStatus *pVVar4;
  type_conflict5 tVar5;
  bool bVar6;
  int iVar7;
  VarStatus VVar8;
  long lVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  pointer pnVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  int _k;
  long lVar14;
  byte bVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aik;
  cpp_dec_float<200U,_int,_void> local_5b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar15 = 0;
  VVar8 = cStatus->data[this->m_k];
  if (VVar8 == ON_UPPER) {
LAB_004221c6:
    cVar1 = this->m_strictUp;
joined_r0x004221ce:
    if (cVar1 == '\0') {
      return;
    }
  }
  else {
    if (VVar8 != FIXED) {
      if (VVar8 != ON_LOWER) {
        return;
      }
      cVar1 = this->m_strictLo;
      goto joined_r0x004221ce;
    }
    if (this->m_maxSense == true) {
      local_5b8.data._M_elems[0] = 0;
      tVar5 = boost::multiprecision::operator>
                        ((r->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + this->m_j,(int *)&local_5b8);
      if ((!tVar5) || (this->m_strictUp == false)) {
        aik.m_backend.data._M_elems[0] = 0;
        tVar5 = boost::multiprecision::operator<
                          ((r->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + this->m_j,(int *)&aik);
        if ((!tVar5) || (this->m_strictLo == false)) goto LAB_00422170;
      }
    }
    else {
LAB_00422170:
      if (this->m_maxSense != false) {
        return;
      }
      result.m_backend.data._M_elems._0_8_ =
           result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar5 = boost::multiprecision::operator>
                        ((r->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + this->m_j,(int *)&result);
      if ((!tVar5) || (this->m_strictLo == false)) {
        result_2.m_backend.data._M_elems._0_8_ =
             result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar5 = boost::multiprecision::operator<
                          ((r->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + this->m_j,(int *)&result_2);
        if (!tVar5) {
          return;
        }
        goto LAB_004221c6;
      }
    }
  }
  pnVar12 = &this->m_kObj;
  pcVar10 = &local_5b8;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pcVar10->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar12 + (ulong)bVar15 * -8 + 4);
    pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar15 * -8 + 4);
  }
  local_5b8.exp = (this->m_kObj).m_backend.exp;
  local_5b8.neg = (this->m_kObj).m_backend.neg;
  local_5b8.fpclass = (this->m_kObj).m_backend.fpclass;
  local_5b8.prec_elem = (this->m_kObj).m_backend.prec_elem;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[](&aik,&(this->m_col).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_i);
  lVar9 = 0;
  for (lVar14 = 0;
      lVar14 < (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused; lVar14 = lVar14 + 1) {
    pNVar2 = (this->m_col).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    iVar7 = *(int *)((long)(&pNVar2->val + 1) + lVar9);
    if (iVar7 != this->m_i) {
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)(pNVar2->val).m_backend.data._M_elems + lVar9),
                 &(y->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&local_5b8,&result.m_backend);
    }
    lVar9 = lVar9 + 0x84;
  }
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,&local_5b8,&aik.m_backend);
  iVar7 = this->m_i;
  pnVar3 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar10 = &result.m_backend;
  pnVar11 = pnVar3 + iVar7;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
    pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar15 * -8 + 4);
    pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
  }
  pnVar3[iVar7].m_backend.exp = result.m_backend.exp;
  pnVar3[iVar7].m_backend.neg = result.m_backend.neg;
  pnVar3[iVar7].m_backend.fpclass = result.m_backend.fpclass;
  pnVar3[iVar7].m_backend.prec_elem = result.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)
             ((r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_k),0.0);
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 0x1c;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems[8] = 0;
  result_1.m_backend.data._M_elems[9] = 0;
  result_1.m_backend.data._M_elems[10] = 0;
  result_1.m_backend.data._M_elems[0xb] = 0;
  result_1.m_backend.data._M_elems[0xc] = 0;
  result_1.m_backend.data._M_elems[0xd] = 0;
  result_1.m_backend.data._M_elems[0xe] = 0;
  result_1.m_backend.data._M_elems[0xf] = 0;
  result_1.m_backend.data._M_elems[0x10] = 0;
  result_1.m_backend.data._M_elems[0x11] = 0;
  result_1.m_backend.data._M_elems[0x12] = 0;
  result_1.m_backend.data._M_elems[0x13] = 0;
  result_1.m_backend.data._M_elems[0x14] = 0;
  result_1.m_backend.data._M_elems[0x15] = 0;
  result_1.m_backend.data._M_elems[0x16] = 0;
  result_1.m_backend.data._M_elems[0x17] = 0;
  result_1.m_backend.data._M_elems[0x18] = 0;
  result_1.m_backend.data._M_elems[0x19] = 0;
  result_1.m_backend.data._M_elems._104_5_ = 0;
  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_1.m_backend,&local_5b8,&(this->m_aij).m_backend);
  result_2.m_backend.fpclass = cpp_dec_float_finite;
  result_2.m_backend.prec_elem = 0x1c;
  result_2.m_backend.data._M_elems[0] = 0;
  result_2.m_backend.data._M_elems[1] = 0;
  result_2.m_backend.data._M_elems[2] = 0;
  result_2.m_backend.data._M_elems[3] = 0;
  result_2.m_backend.data._M_elems[4] = 0;
  result_2.m_backend.data._M_elems[5] = 0;
  result_2.m_backend.data._M_elems[6] = 0;
  result_2.m_backend.data._M_elems[7] = 0;
  result_2.m_backend.data._M_elems[8] = 0;
  result_2.m_backend.data._M_elems[9] = 0;
  result_2.m_backend.data._M_elems[10] = 0;
  result_2.m_backend.data._M_elems[0xb] = 0;
  result_2.m_backend.data._M_elems[0xc] = 0;
  result_2.m_backend.data._M_elems[0xd] = 0;
  result_2.m_backend.data._M_elems[0xe] = 0;
  result_2.m_backend.data._M_elems[0xf] = 0;
  result_2.m_backend.data._M_elems[0x10] = 0;
  result_2.m_backend.data._M_elems[0x11] = 0;
  result_2.m_backend.data._M_elems[0x12] = 0;
  result_2.m_backend.data._M_elems[0x13] = 0;
  result_2.m_backend.data._M_elems[0x14] = 0;
  result_2.m_backend.data._M_elems[0x15] = 0;
  result_2.m_backend.data._M_elems[0x16] = 0;
  result_2.m_backend.data._M_elems[0x17] = 0;
  result_2.m_backend.data._M_elems[0x18] = 0;
  result_2.m_backend.data._M_elems[0x19] = 0;
  result_2.m_backend.data._M_elems._104_5_ = 0;
  result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_2.m_backend.exp = 0;
  result_2.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_2.m_backend,&result_1.m_backend,&aik.m_backend);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,&(this->m_jObj).m_backend,&result_2.m_backend);
  iVar7 = this->m_j;
  pnVar3 = (r->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar10 = &result.m_backend;
  pnVar11 = pnVar3 + iVar7;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
    pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar15 * -8 + 4);
    pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
  }
  pnVar3[iVar7].m_backend.exp = result.m_backend.exp;
  pnVar3[iVar7].m_backend.neg = result.m_backend.neg;
  pnVar3[iVar7].m_backend.fpclass = result.m_backend.fpclass;
  pnVar3[iVar7].m_backend.prec_elem = result.m_backend.prec_elem;
  iVar7 = this->m_j;
  if (this->m_jFixed != false) {
    VVar8 = FIXED;
    goto LAB_004224f1;
  }
  pnVar3 = (r->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar11 = pnVar3 + iVar7;
  pnVar12 = &local_b0;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar12->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
    pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
    pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar12 + ((ulong)bVar15 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = pnVar3[iVar7].m_backend.exp;
  local_b0.m_backend.neg = pnVar3[iVar7].m_backend.neg;
  local_b0.m_backend.fpclass = pnVar3[iVar7].m_backend.fpclass;
  local_b0.m_backend.prec_elem = pnVar3[iVar7].m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_130,0,(type *)0x0);
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_1b0,this);
  bVar6 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_130,&local_1b0);
  if (bVar6) {
LAB_004224ea:
    iVar7 = this->m_j;
    VVar8 = ON_LOWER;
  }
  else {
    iVar7 = this->m_j;
    pnVar3 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar11 = pnVar3 + iVar7;
    pnVar12 = &local_230;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = pnVar3[iVar7].m_backend.exp;
    local_230.m_backend.neg = pnVar3[iVar7].m_backend.neg;
    local_230.m_backend.fpclass = pnVar3[iVar7].m_backend.fpclass;
    local_230.m_backend.prec_elem = pnVar3[iVar7].m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_2b0,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_230,&local_2b0);
    if (bVar6) {
      iVar7 = this->m_j;
      pnVar3 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = 0x1c;
      pnVar11 = pnVar3 + iVar7;
      pnVar12 = &local_330;
      for (lVar14 = lVar9; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      local_330.m_backend.exp = pnVar3[iVar7].m_backend.exp;
      local_330.m_backend.neg = pnVar3[iVar7].m_backend.neg;
      local_330.m_backend.fpclass = pnVar3[iVar7].m_backend.fpclass;
      local_330.m_backend.prec_elem = pnVar3[iVar7].m_backend.prec_elem;
      pnVar12 = &this->m_Lo_j;
      pnVar13 = &local_3b0;
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + (ulong)bVar15 * -8 + 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      local_3b0.m_backend.exp = (this->m_Lo_j).m_backend.exp;
      local_3b0.m_backend.neg = (this->m_Lo_j).m_backend.neg;
      local_3b0.m_backend.fpclass = (this->m_Lo_j).m_backend.fpclass;
      local_3b0.m_backend.prec_elem = (this->m_Lo_j).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_430,this);
      bVar6 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_330,&local_3b0,&local_430);
      if (bVar6) goto LAB_004224ea;
    }
    iVar7 = this->m_j;
    VVar8 = ON_UPPER;
  }
LAB_004224f1:
  pVVar4 = cStatus->data;
  pVVar4[iVar7] = VVar8;
  pVVar4[this->m_k] = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::DoubletonEquationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // dual:
   if((cStatus[m_k]  != SPxSolverBase<R>::BASIC) &&
         ((cStatus[m_k] == SPxSolverBase<R>::ON_LOWER && m_strictLo) ||
          (cStatus[m_k] == SPxSolverBase<R>::ON_UPPER && m_strictUp) ||
          (cStatus[m_k] == SPxSolverBase<R>::FIXED    &&
           ((m_maxSense && ((r[m_j] > 0 && m_strictUp) || (r[m_j] < 0 && m_strictLo))) ||
            (!m_maxSense && ((r[m_j] > 0 && m_strictLo) || (r[m_j] < 0 && m_strictUp)))))))
   {
      R val  = m_kObj;
      R aik  = m_col[m_i];

      for(int _k = 0; _k < m_col.size(); ++_k)
      {
         if(m_col.index(_k) != m_i)
            val -= m_col.value(_k) * y[m_col.index(_k)];
      }

      y[m_i] = val / aik;
      r[m_k] = 0.0;

      r[m_j] = m_jObj - val * m_aij / aik;

      SOPLEX_ASSERT_WARN("WMAISM73", isNotZero(m_aij * aik, this->epsilon()));

      // basis:
      if(m_jFixed)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else
      {
         if(GT(r[m_j], (R) 0, this->epsilon()) || (isZero(r[m_j], this->epsilon())
               && EQ(x[m_j], m_Lo_j, this->epsilon())))
            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
         else
            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }

      cStatus[m_k] = SPxSolverBase<R>::BASIC;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM23 Dimension doesn't match after this step.");
   }

#endif
}